

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::TextureGatherInstance::init(TextureGatherInstance *this,EVP_PKEY_CTX *ctx)

{
  OffsetSize offsetSize;
  bool bVar1;
  deBool dVar2;
  VkComponentSwizzle VVar3;
  int extraout_EAX;
  TestContext *this_00;
  TestLog *this_01;
  NotSupportedError *this_02;
  VkPhysicalDeviceProperties *pVVar4;
  int *piVar5;
  TestLog *pTVar6;
  TestError *pTVar7;
  char *pcVar8;
  TextureSwizzleComponent *pTVar9;
  TextureBinding *this_03;
  MessageBuilder *pMVar10;
  VkComponentMapping componentMapping_;
  VkCompareOp local_a94;
  MessageBuilder local_a90;
  VkFilter local_910;
  VkFilter local_90c;
  VkSamplerAddressMode local_908;
  VkSamplerAddressMode local_904;
  MessageBuilder local_900;
  MessageBuilder local_780;
  MessageBuilder local_600;
  MessageBuilder local_480;
  undefined1 local_300 [8];
  VkComponentMapping components;
  Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4> *swizzle;
  undefined1 local_2d5;
  int local_2d4;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_28d;
  int local_28c;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  LogNumber<long> local_1d0;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  LogNumber<long> local_e8;
  Vector<int,_2> local_78;
  IVec2 offsetRange;
  VkPhysicalDeviceFeatures *deviceFeatures;
  undefined1 local_44 [8];
  Parameters textureParams;
  TextureBindingSp textureBinding;
  TestLog *log;
  TextureGatherInstance *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)&textureParams.samples);
  componentMapping_ = ::vk::makeComponentMappingRGBA();
  TextureBinding::Parameters::Parameters
            ((Parameters *)local_44,0,componentMapping_,VK_SAMPLE_COUNT_1_BIT,INIT_UPLOAD_DATA);
  bVar1 = requireGpuShader5((this->m_baseParams).gatherType,(this->m_baseParams).offsetSize);
  if ((bVar1) &&
     (offsetRange.m_data =
           (int  [2])
           Context::getDeviceFeatures
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context),
     *(VkBool32 *)((long)offsetRange.m_data + 0x70) == 0)) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Extended set of image gather instructions are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
               ,0x493);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if ((this->m_baseParams).offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    offsetSize = (this->m_baseParams).offsetSize;
    pVVar4 = Context::getDeviceProperties
                       ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    getOffsetRange((anon_unknown_0 *)&local_78,offsetSize,&pVVar4->limits);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"ImplementationMinTextureGatherOffset",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Implementation\'s value for minTexelGatherOffset",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
    piVar5 = tcu::Vector<int,_2>::operator[](&local_78,0);
    tcu::LogNumber<long>::LogNumber
              (&local_e8,&local_108,&local_130,&local_158,QP_KEY_TAG_NONE,(long)*piVar5);
    pTVar6 = tcu::TestLog::operator<<(this_01,&local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"ImplementationMaxTextureGatherOffset",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"Implementation\'s value for maxTexelGatherOffset",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_241);
    piVar5 = tcu::Vector<int,_2>::operator[](&local_78,1);
    tcu::LogNumber<long>::LogNumber
              (&local_1d0,&local_1f0,&local_218,&local_240,QP_KEY_TAG_NONE,(long)*piVar5);
    tcu::TestLog::operator<<(pTVar6,&local_1d0);
    tcu::LogNumber<long>::~LogNumber(&local_1d0);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    tcu::LogNumber<long>::~LogNumber(&local_e8);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || (piVar5 = tcu::Vector<int,_2>::operator[](&local_78,0), -8 < *piVar5)) {
        local_28d = 1;
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        local_28c = -8;
        de::toString<int>(&local_288,&local_28c);
        std::operator+(&local_268,"minTexelGatherOffset must be at most ",&local_288);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar7,pcVar8,"offsetRange[0] <= SPEC_MAX_MIN_OFFSET",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
                   ,0x49c);
        local_28d = 0;
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || (piVar5 = tcu::Vector<int,_2>::operator[](&local_78,1), *piVar5 < 7)) {
        local_2d5 = 1;
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        local_2d4 = 7;
        de::toString<int>(&local_2d0,&local_2d4);
        std::operator+(&local_2b0,"maxTexelGatherOffset must be at least ",&local_2d0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar7,pcVar8,"offsetRange[1] >= SPEC_MIN_MAX_OFFSET",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
                   ,0x49d);
        local_2d5 = 0;
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[9])(&swizzle);
  de::SharedPtr<vkt::sr::TextureBinding>::operator=
            ((SharedPtr<vkt::sr::TextureBinding> *)&textureParams.samples,
             (SharedPtr<vkt::sr::TextureBinding> *)&swizzle);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)&swizzle)
  ;
  bVar1 = MaybeTextureSwizzle::isSome(&(this->m_baseParams).textureSwizzle);
  if (bVar1) {
    components._8_8_ = MaybeTextureSwizzle::getSwizzle(&(this->m_baseParams).textureSwizzle);
    pTVar9 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                       ((Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4> *)
                        components._8_8_,0);
    VVar3 = getTextureSwizzleComponent(*pTVar9);
    local_300._0_4_ = VVar3;
    pTVar9 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                       ((Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4> *)
                        components._8_8_,1);
    VVar3 = getTextureSwizzleComponent(*pTVar9);
    local_300._4_4_ = VVar3;
    pTVar9 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                       ((Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4> *)
                        components._8_8_,2);
    VVar3 = getTextureSwizzleComponent(*pTVar9);
    components.r = VVar3;
    pTVar9 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                       ((Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4> *)
                        components._8_8_,3);
    VVar3 = getTextureSwizzleComponent(*pTVar9);
    components.g = VVar3;
    local_44._4_4_ = local_300._0_4_;
    textureParams.baseMipLevel = local_300._4_4_;
    components.r = (VkComponentSwizzle)components._0_8_;
    components.g = SUB84(components._0_8_,4);
    textureParams.componentMapping.r = components.r;
    textureParams.componentMapping.g = components.g;
  }
  if ((this->m_baseParams).baseLevel != 0) {
    local_44._0_4_ = (this->m_baseParams).baseLevel;
  }
  this_03 = de::SharedPtr<vkt::sr::TextureBinding>::operator->
                      ((SharedPtr<vkt::sr::TextureBinding> *)&textureParams.samples);
  TextureBinding::setParameters(this_03,(Parameters *)local_44);
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(&(this->super_ShaderRenderCaseInstance).m_textures,
              (value_type *)&textureParams.samples);
  tcu::TestLog::operator<<(&local_900,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_900,(char (*) [23])"Texture base level is ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&(this->m_baseParams).baseLevel);
  pTVar6 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_780,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_780,(char (*) [24])"s and t wrap modes are ");
  local_904 = ::vk::mapWrapMode((this->m_baseParams).wrapS);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_904);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x12fcbb9);
  local_908 = ::vk::mapWrapMode((this->m_baseParams).wrapT);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_908);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [15])0x1373bf0);
  pTVar6 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_600,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_600,(char (*) [49])"Minification and magnification filter modes are ")
  ;
  local_90c = ::vk::mapFilterMode((this->m_baseParams).minFilter);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_90c);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x12fcbb9);
  local_910 = ::vk::mapFilterMode((this->m_baseParams).magFilter);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_910);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [16])", respectively ");
  pMVar10 = tcu::MessageBuilder::operator<<
                      (pMVar10,(char (*) [56])
                               "(note that they should have no effect on gather result)");
  pTVar6 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_480,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_480,(char (*) [23])"Using texture swizzle ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&(this->m_baseParams).textureSwizzle);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_480);
  tcu::MessageBuilder::~MessageBuilder(&local_600);
  tcu::MessageBuilder::~MessageBuilder(&local_780);
  tcu::MessageBuilder::~MessageBuilder(&local_900);
  if ((this->m_baseParams).shadowCompareMode != COMPAREMODE_NONE) {
    tcu::TestLog::operator<<(&local_a90,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_a90,(char (*) [28])"Using texture compare func ");
    local_a94 = ::vk::mapCompareMode((this->m_baseParams).shadowCompareMode);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_a94);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a90);
  }
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)&textureParams.samples);
  return extraout_EAX;
}

Assistant:

void TextureGatherInstance::init (void)
{
	TestLog&						log					= m_context.getTestContext().getLog();
	TextureBindingSp				textureBinding;
	TextureBinding::Parameters		textureParams;

	// Check prerequisites.
	if (requireGpuShader5(m_baseParams.gatherType, m_baseParams.offsetSize))
	{
		const vk::VkPhysicalDeviceFeatures&		deviceFeatures	= m_context.getDeviceFeatures();
		if (!deviceFeatures.shaderImageGatherExtended)
			TCU_THROW(NotSupportedError, "Extended set of image gather instructions are not supported");
	}

	// Log and check implementation offset limits, if appropriate.
	if (m_baseParams.offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)
	{
		const IVec2		offsetRange		= getOffsetRange(m_baseParams.offsetSize, m_context.getDeviceProperties().limits);
		log << TestLog::Integer("ImplementationMinTextureGatherOffset", "Implementation's value for minTexelGatherOffset", "", QP_KEY_TAG_NONE, offsetRange[0])
			<< TestLog::Integer("ImplementationMaxTextureGatherOffset", "Implementation's value for maxTexelGatherOffset", "", QP_KEY_TAG_NONE, offsetRange[1]);
		TCU_CHECK_MSG(offsetRange[0] <= SPEC_MAX_MIN_OFFSET, ("minTexelGatherOffset must be at most " + de::toString((int)SPEC_MAX_MIN_OFFSET)).c_str());
		TCU_CHECK_MSG(offsetRange[1] >= SPEC_MIN_MAX_OFFSET, ("maxTexelGatherOffset must be at least " + de::toString((int)SPEC_MIN_MAX_OFFSET)).c_str());
	}

	// Initialize texture.

	textureBinding = createTexture();

	if (m_baseParams.textureSwizzle.isSome())
	{
		const tcu::Vector<TextureSwizzleComponent, 4>&	swizzle		= m_baseParams.textureSwizzle.getSwizzle();

		const vk::VkComponentMapping					components	=
		{
			getTextureSwizzleComponent(swizzle[0]),
			getTextureSwizzleComponent(swizzle[1]),
			getTextureSwizzleComponent(swizzle[2]),
			getTextureSwizzleComponent(swizzle[3])
		};

		textureParams.componentMapping = components;
	}

	if (m_baseParams.baseLevel != 0)
		textureParams.baseMipLevel = m_baseParams.baseLevel;

	textureBinding->setParameters(textureParams);
	m_textures.push_back(textureBinding);

	log << TestLog::Message << "Texture base level is " << m_baseParams.baseLevel << TestLog::EndMessage
		<< TestLog::Message << "s and t wrap modes are "
							<< vk::mapWrapMode(m_baseParams.wrapS) << " and "
							<< vk::mapWrapMode(m_baseParams.wrapT) << ", respectively" << TestLog::EndMessage
		<< TestLog::Message << "Minification and magnification filter modes are "
							<< vk::mapFilterMode(m_baseParams.minFilter) << " and "
							<< vk::mapFilterMode(m_baseParams.magFilter) << ", respectively "
							<< "(note that they should have no effect on gather result)"
							<< TestLog::EndMessage
		<< TestLog::Message << "Using texture swizzle " << m_baseParams.textureSwizzle << TestLog::EndMessage;

	if (m_baseParams.shadowCompareMode != tcu::Sampler::COMPAREMODE_NONE)
		log << TestLog::Message << "Using texture compare func " << vk::mapCompareMode(m_baseParams.shadowCompareMode) << TestLog::EndMessage;
}